

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O1

int dwarf_get_loclist_head_basics
              (Dwarf_Loc_Head_c head,Dwarf_Small *lkind,Dwarf_Unsigned *lle_count,
              Dwarf_Unsigned *lle_version,Dwarf_Unsigned *loclists_index_returned,
              Dwarf_Unsigned *bytes_total_in_lle,Dwarf_Half *offset_size,Dwarf_Half *address_size,
              Dwarf_Half *segment_selector_size,Dwarf_Unsigned *overall_offset_of_this_context,
              Dwarf_Unsigned *total_length_of_this_context,Dwarf_Unsigned *offset_table_offset,
              Dwarf_Unsigned *offset_table_entrycount,Dwarf_Bool *loclists_base_present,
              Dwarf_Unsigned *loclists_base,Dwarf_Bool *loclists_base_address_present,
              Dwarf_Unsigned *loclists_base_address,Dwarf_Bool *loclists_debug_addr_base_present,
              Dwarf_Unsigned *loclists_debug_addr_base,Dwarf_Unsigned *loclists_offset_lle_set,
              Dwarf_Error *error)

{
  Dwarf_Loclists_Context pDVar1;
  char *msg;
  
  if (head == (Dwarf_Loc_Head_c)0x0) {
    msg = "DW_DLE_DBG_NULLNULL Dwarf_Loc_Head_c argument passed to dwarf_get_loclist_head_basics()";
  }
  else {
    if (head->ll_magic == 0xadab4) {
      *lkind = (Dwarf_Small)head->ll_lkind;
      *lle_count = head->ll_locdesc_count;
      *lle_version = (ulong)head->ll_cuversion;
      *loclists_index_returned = head->ll_index;
      *bytes_total_in_lle = head->ll_bytes_total;
      *offset_size = (Dwarf_Half)head->ll_offset_size;
      *address_size = (Dwarf_Half)head->ll_address_size;
      *segment_selector_size = (Dwarf_Half)head->ll_segment_selector_size;
      pDVar1 = head->ll_localcontext;
      if (pDVar1 != (Dwarf_Loclists_Context)0x0) {
        *overall_offset_of_this_context = pDVar1->lc_header_offset;
        *total_length_of_this_context = pDVar1->lc_length;
        *offset_table_offset = pDVar1->lc_offsets_off_in_sect;
        *offset_table_entrycount = pDVar1->lc_offset_entry_count;
      }
      *loclists_base_present = head->ll_at_loclists_base_present;
      *loclists_base = head->ll_at_loclists_base;
      *loclists_base_address_present = head->ll_cu_base_address_present;
      *loclists_base_address = head->ll_cu_base_address;
      *loclists_debug_addr_base_present = head->ll_cu_addr_base_present;
      *loclists_debug_addr_base = head->ll_cu_addr_base;
      *loclists_offset_lle_set = head->ll_llearea_offset;
      return 0;
    }
    msg = 
    "DW_DLE_DBG_NULLNULL Dwarf_Loc_Head_c  not set with LOCLISTS_MAGIC in argument passed to dwarf_get_loclist_head_basics()"
    ;
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,msg);
  return 1;
}

Assistant:

int dwarf_get_loclist_head_basics(Dwarf_Loc_Head_c head,
    Dwarf_Small    * lkind,
    Dwarf_Unsigned * lle_count,
    Dwarf_Unsigned * lle_version,
    Dwarf_Unsigned * loclists_index_returned,
    Dwarf_Unsigned * bytes_total_in_lle,
    Dwarf_Half     * offset_size,
    Dwarf_Half     * address_size,
    Dwarf_Half     * segment_selector_size,
    Dwarf_Unsigned * overall_offset_of_this_context,
    Dwarf_Unsigned * total_length_of_this_context,
    Dwarf_Unsigned * offset_table_offset,
    Dwarf_Unsigned * offset_table_entrycount,
    Dwarf_Bool     * loclists_base_present,
    Dwarf_Unsigned * loclists_base,
    Dwarf_Bool     * loclists_base_address_present,
    Dwarf_Unsigned * loclists_base_address,
    Dwarf_Bool     * loclists_debug_addr_base_present,
    Dwarf_Unsigned * loclists_debug_addr_base,
    Dwarf_Unsigned * loclists_offset_lle_set,
    Dwarf_Error *error)
{
    Dwarf_Loclists_Context loccontext = 0;

    if (!head) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "NULL Dwarf_Loc_Head_c "
            "argument passed to "
            "dwarf_get_loclist_head_basics()");
        return DW_DLV_ERROR;
    }
    if (head->ll_magic != LOCLISTS_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL"
            "NULL Dwarf_Loc_Head_c "
            " not set with LOCLISTS_MAGIC in "
            "argument passed to "
            "dwarf_get_loclist_head_basics()");
        return DW_DLV_ERROR;
    }
    *lkind = (Dwarf_Small)head->ll_lkind;
    *lle_count = head->ll_locdesc_count;
    *lle_version = head->ll_cuversion;
    *loclists_index_returned = head->ll_index;
    *bytes_total_in_lle = head->ll_bytes_total;
    *offset_size = head->ll_offset_size;
    *address_size = head->ll_address_size;
    *segment_selector_size = head->ll_segment_selector_size;
    /*  If a dwarf_expression, no ll_loccontext */
    loccontext = head->ll_localcontext;
    if (loccontext) {
        *overall_offset_of_this_context =
            loccontext->lc_header_offset;
        *total_length_of_this_context = loccontext->lc_length;
        *offset_table_offset =  loccontext->lc_offsets_off_in_sect;
        *offset_table_entrycount = loccontext->lc_offset_entry_count;
    }
    *loclists_base_present = head->ll_at_loclists_base_present;
    *loclists_base= head->ll_at_loclists_base;

    *loclists_base_address_present = head->ll_cu_base_address_present;
    *loclists_base_address= head->ll_cu_base_address;

    *loclists_debug_addr_base_present = head->ll_cu_addr_base_present;
    *loclists_debug_addr_base  = head->ll_cu_addr_base;
    *loclists_offset_lle_set = head->ll_llearea_offset;
    return DW_DLV_OK;
}